

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall capnp::compiler::Compiler::eagerlyCompile(Compiler *this,uint64_t id,uint eagerness)

{
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *this_00;
  
  this_00 = &this->impl;
  kj::_::Mutex::lock(&this_00->mutex,0);
  Impl::eagerlyCompile((this->impl).value.ptr,id,eagerness,&this->loader);
  if (this_00 != (MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)0x0) {
    kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  return;
}

Assistant:

void Compiler::eagerlyCompile(uint64_t id, uint eagerness) const {
  impl.lockExclusive()->get()->eagerlyCompile(id, eagerness, loader);
}